

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O0

TSTNode<unsigned_int> * __thiscall
BurstRecursive<unsigned_int>::operator()
          (BurstRecursive<unsigned_int> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,uint *oracle,
          size_t depth)

{
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  reference ppvVar4;
  size_type sVar5;
  uint *puVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  ulong uVar10;
  reference ppuVar11;
  TSTNode<unsigned_int> *pTVar12;
  float local_c4;
  reference local_c0;
  uint local_ac;
  undefined1 local_a8 [4];
  uint i_2;
  uint local_94;
  undefined1 local_90 [4];
  uint i_1;
  uint local_7c;
  size_type sStack_78;
  uint i;
  size_t bsize1;
  size_t bsize0;
  size_t bsize;
  uint local_58;
  uint local_54;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *pvStack_50;
  uint threshold;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket2;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket1;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket0;
  TSTNode<unsigned_int> *local_30;
  TSTNode<unsigned_int> *new_node;
  size_t depth_local;
  uint *oracle_local;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_local;
  BurstRecursive<unsigned_int> *this_local;
  
  new_node = (TSTNode<unsigned_int> *)depth;
  depth_local = (size_t)oracle;
  oracle_local = (uint *)bucket;
  bucket_local = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this;
  local_30 = BurstSimple<unsigned_int>::operator()
                       ((BurstSimple<unsigned_int> *)((long)&bucket0 + 7),bucket,oracle,depth);
  ppvVar4 = std::array<void_*,_3UL>::operator[](&local_30->buckets,0);
  bucket1 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)*ppvVar4;
  ppvVar4 = std::array<void_*,_3UL>::operator[](&local_30->buckets,1);
  bucket2 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)*ppvVar4;
  ppvVar4 = std::array<void_*,_3UL>::operator[](&local_30->buckets,2);
  pvStack_50 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)*ppvVar4;
  local_58 = 100;
  sVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size
                    ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)oracle_local);
  local_c4 = (float)sVar5;
  bsize._4_4_ = (undefined4)(long)(local_c4 * 0.7);
  puVar6 = std::max<unsigned_int>(&local_58,(uint *)((long)&bsize + 4));
  local_54 = *puVar6;
  sVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket1);
  sVar7 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket2);
  sVar8 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(pvStack_50);
  sVar9 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size
                    ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)oracle_local);
  if (sVar5 + sVar7 + sVar8 == sVar9) {
    bsize0 = 0;
    bsize1 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket1);
    sStack_78 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket2);
    sVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket1);
    if (local_54 < sVar5) {
      for (local_7c = 0; uVar10 = (ulong)local_7c,
          sVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket1),
          uVar10 < sVar5; local_7c = local_7c + 1) {
        ppuVar11 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                             (bucket1,(ulong)local_7c);
        uVar3 = get_char<unsigned_int>(*ppuVar11,(size_t)new_node);
        *(uint32_t *)(depth_local + (bsize0 + local_7c) * 4) = uVar3;
      }
      pTVar12 = operator()(this,bucket1,(uint *)depth_local,(size_t)new_node);
      ppvVar4 = std::array<void_*,_3UL>::operator[](&local_30->buckets,0);
      pvVar1 = bucket1;
      *ppvVar4 = pTVar12;
      if (bucket1 != (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector(bucket1);
        operator_delete(pvVar1);
      }
      std::bitset<3UL>::operator[]((bitset<3UL> *)local_90,(size_t)&local_30->is_tst);
      std::bitset<3UL>::reference::operator=((reference *)local_90,true);
      std::bitset<3UL>::reference::~reference((reference *)local_90);
    }
    bsize0 = bsize1 + bsize0;
    sVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket2);
    if ((local_54 < sVar5) && (bVar2 = is_end<unsigned_int>(local_30->pivot), !bVar2)) {
      for (local_94 = 0; uVar10 = (ulong)local_94,
          sVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket2),
          uVar10 < sVar5; local_94 = local_94 + 1) {
        ppuVar11 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                             (bucket2,(ulong)local_94);
        uVar3 = get_char<unsigned_int>(*ppuVar11,(size_t)((long)(new_node->buckets)._M_elems + 4));
        *(uint32_t *)(depth_local + (bsize0 + local_94) * 4) = uVar3;
      }
      pTVar12 = operator()(this,bucket2,(uint *)(depth_local + bsize0 * 4),
                           (size_t)((long)(new_node->buckets)._M_elems + 4));
      ppvVar4 = std::array<void_*,_3UL>::operator[](&local_30->buckets,1);
      pvVar1 = bucket2;
      *ppvVar4 = pTVar12;
      if (bucket2 != (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector(bucket2);
        operator_delete(pvVar1);
      }
      std::bitset<3UL>::operator[]((bitset<3UL> *)local_a8,(size_t)&local_30->is_tst);
      std::bitset<3UL>::reference::operator=((reference *)local_a8,true);
      std::bitset<3UL>::reference::~reference((reference *)local_a8);
    }
    bsize0 = sStack_78 + bsize0;
    sVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(pvStack_50);
    if (local_54 < sVar5) {
      for (local_ac = 0; uVar10 = (ulong)local_ac,
          sVar5 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(pvStack_50),
          uVar10 < sVar5; local_ac = local_ac + 1) {
        ppuVar11 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                             (pvStack_50,(ulong)local_ac);
        uVar3 = get_char<unsigned_int>(*ppuVar11,(size_t)new_node);
        *(uint32_t *)(depth_local + (bsize0 + local_ac) * 4) = uVar3;
      }
      pTVar12 = operator()(this,pvStack_50,(uint *)(depth_local + bsize0 * 4),(size_t)new_node);
      ppvVar4 = std::array<void_*,_3UL>::operator[](&local_30->buckets,2);
      pvVar1 = pvStack_50;
      *ppvVar4 = pTVar12;
      if (pvStack_50 != (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)0x0) {
        std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~vector(pvStack_50);
        operator_delete(pvVar1);
      }
      std::bitset<3UL>::operator[]((bitset<3UL> *)&local_c0,(size_t)&local_30->is_tst);
      std::bitset<3UL>::reference::operator=(&local_c0,true);
      std::bitset<3UL>::reference::~reference(&local_c0);
    }
    return local_30;
  }
  __assert_fail("bucket0->size() + bucket1->size() + bucket2->size() == bucket.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort_mkq.cpp"
                ,0x6c,
                "TSTNode<CharT> *BurstRecursive<unsigned int>::operator()(const BucketT &, CharT *, size_t) const [CharT = unsigned int, BucketT = std::vector<unsigned char *>]"
               );
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t depth) const
	{
		debug() << "BurstRecursive() bucket.size()=" << bucket.size() << " depth=" << depth << "\n"; debug_indent;
		TSTNode<CharT>* new_node
			= BurstSimple<CharT>()(bucket, oracle, depth);
		BucketT* bucket0 = static_cast<BucketT*>(new_node->buckets[0]);
		BucketT* bucket1 = static_cast<BucketT*>(new_node->buckets[1]);
		BucketT* bucket2 = static_cast<BucketT*>(new_node->buckets[2]);
		const unsigned threshold = std::max(100u,
				unsigned(0.7f*bucket.size()));
		assert(bucket0->size() + bucket1->size() + bucket2->size()
				== bucket.size());
		size_t bsize = 0;
		const size_t bsize0 = bucket0->size();
		const size_t bsize1 = bucket1->size();
		if (bucket0->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket0: size()=" << bucket0->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket0->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket0)[i], depth);
			new_node->buckets[0] = this->operator()(*bucket0,
					oracle, depth);
			delete bucket0;
			new_node->is_tst[0] = true;
		}
		bsize += bsize0;
		if (bucket1->size() > threshold and not is_end(new_node->pivot)) {
			debug() << "BurstRecursive() bursting bucket1: size()=" << bucket1->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket1->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket1)[i], depth+sizeof(CharT));
			new_node->buckets[1] = this->operator()(*bucket1,
					oracle+bsize, depth+sizeof(CharT));
			delete bucket1;
			new_node->is_tst[1] = true;
		}
		bsize += bsize1;
		if (bucket2->size() > threshold) {
			debug() << "BurstRecursive() bursting bucket2: size()=" << bucket2->size()
				<< " threshold=" << threshold << " bsize=" << bsize << "\n";
			for (unsigned i=0; i < bucket2->size(); ++i)
				oracle[bsize+i] = get_char<CharT>((*bucket2)[i], depth);
			new_node->buckets[2] = this->operator()(*bucket2,
					oracle+bsize, depth);
			delete bucket2;
			new_node->is_tst[2] = true;
		}
		return new_node;
	}